

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O0

mz_bool buminiz::tdefl_compress_lz_codes(tdefl_compressor *d)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  undefined1 *puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  long in_RDI;
  mz_uint len_1;
  mz_uint bits_1;
  mz_uint len;
  mz_uint bits;
  mz_uint32 n;
  mz_uint lit;
  mz_uint match_dist;
  mz_uint match_len;
  mz_uint num_extra_bits;
  mz_uint sym;
  mz_uint n1;
  mz_uint n0;
  mz_uint s1;
  mz_uint s0;
  mz_uint bits_in;
  mz_uint64 bit_buffer;
  mz_uint8 *pLZ_code_buf_end;
  mz_uint8 *pOutput_buf;
  mz_uint8 *pLZ_codes;
  mz_uint flags;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_3c;
  ulong local_38;
  ulong *local_28;
  byte *local_20;
  uint local_14;
  
  local_28 = *(ulong **)(in_RDI + 0x40);
  pbVar4 = *(byte **)(in_RDI + 0x30);
  local_38 = (ulong)*(uint *)(in_RDI + 0x60);
  local_3c = *(uint *)(in_RDI + 0x5c);
  local_14 = 1;
  local_20 = (byte *)(in_RDI + 0x92aa);
  do {
    if (pbVar4 <= local_20) {
      *(ulong **)(in_RDI + 0x40) = local_28;
      *(undefined4 *)(in_RDI + 0x5c) = 0;
      *(undefined4 *)(in_RDI + 0x60) = 0;
      while( true ) {
        if (local_3c == 0) {
          if ((uint)*(ushort *)(in_RDI + 0x8a8a) <= (1 << (*(byte *)(in_RDI + 0x904a) & 0x1f)) - 1U)
          {
            *(uint *)(in_RDI + 0x60) =
                 (uint)*(ushort *)(in_RDI + 0x8a8a) << ((byte)*(undefined4 *)(in_RDI + 0x5c) & 0x1f)
                 | *(uint *)(in_RDI + 0x60);
            *(uint *)(in_RDI + 0x5c) = (uint)*(byte *)(in_RDI + 0x904a) + *(int *)(in_RDI + 0x5c);
            while (7 < *(uint *)(in_RDI + 0x5c)) {
              if (*(ulong *)(in_RDI + 0x40) < *(ulong *)(in_RDI + 0x48)) {
                puVar5 = *(undefined1 **)(in_RDI + 0x40);
                *(undefined1 **)(in_RDI + 0x40) = puVar5 + 1;
                *puVar5 = (char)*(undefined4 *)(in_RDI + 0x60);
              }
              *(uint *)(in_RDI + 0x60) = *(uint *)(in_RDI + 0x60) >> 8;
              *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + -8;
            }
            return (uint)(*(ulong *)(in_RDI + 0x40) < *(ulong *)(in_RDI + 0x48));
          }
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_miniz.h"
                        ,0x702,"mz_bool buminiz::tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        if (local_3c < 0x10) {
          local_80 = local_3c;
        }
        else {
          local_80 = 0x10;
        }
        uVar11 = (uint)local_38 & *(uint *)(mz_bitmasks + (ulong)local_80 * 4);
        if ((1 << ((byte)local_80 & 0x1f)) - 1U < uVar11) break;
        *(uint *)(in_RDI + 0x60) =
             uVar11 << ((byte)*(undefined4 *)(in_RDI + 0x5c) & 0x1f) | *(uint *)(in_RDI + 0x60);
        *(uint *)(in_RDI + 0x5c) = local_80 + *(int *)(in_RDI + 0x5c);
        while (7 < *(uint *)(in_RDI + 0x5c)) {
          if (*(ulong *)(in_RDI + 0x40) < *(ulong *)(in_RDI + 0x48)) {
            puVar5 = *(undefined1 **)(in_RDI + 0x40);
            *(undefined1 **)(in_RDI + 0x40) = puVar5 + 1;
            *puVar5 = (char)*(undefined4 *)(in_RDI + 0x60);
          }
          *(uint *)(in_RDI + 0x60) = *(uint *)(in_RDI + 0x60) >> 8;
          *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + -8;
        }
        local_38 = local_38 >> ((byte)local_80 & 0x3f);
        local_3c = local_3c - local_80;
      }
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_miniz.h"
                    ,0x6fd,"mz_bool buminiz::tdefl_compress_lz_codes(tdefl_compressor *)");
    }
    if (local_14 == 1) {
      local_14 = *local_20 | 0x100;
      local_20 = local_20 + 1;
    }
    uVar11 = local_14;
    if ((local_14 & 1) == 0) {
      pbVar12 = local_20 + 1;
      uVar6 = (uint)*local_20;
      if (*(char *)(in_RDI + 0x8f4a + (ulong)uVar6) == '\0') {
        __assert_fail("d->m_huff_code_sizes[0][lit]",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_miniz.h"
                      ,0x6d7,"mz_bool buminiz::tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      local_38 = (ulong)*(ushort *)(in_RDI + 0x888a + (ulong)uVar6 * 2) << ((byte)local_3c & 0x3f) |
                 local_38;
      local_3c = *(byte *)(in_RDI + 0x8f4a + (ulong)uVar6) + local_3c;
      if (((local_14 & 2) == 0) && (pbVar12 < pbVar4)) {
        uVar11 = local_14 >> 1;
        pbVar13 = local_20 + 2;
        uVar6 = (uint)*pbVar12;
        if (*(char *)(in_RDI + 0x8f4a + (ulong)uVar6) == '\0') {
          __assert_fail("d->m_huff_code_sizes[0][lit]",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_miniz.h"
                        ,0x6de,"mz_bool buminiz::tdefl_compress_lz_codes(tdefl_compressor *)");
        }
        local_38 = (ulong)*(ushort *)(in_RDI + 0x888a + (ulong)uVar6 * 2) << ((byte)local_3c & 0x3f)
                   | local_38;
        local_3c = *(byte *)(in_RDI + 0x8f4a + (ulong)uVar6) + local_3c;
        pbVar12 = pbVar13;
        if (((uVar11 & 2) == 0) && (pbVar13 < pbVar4)) {
          uVar11 = (uint)*pbVar13;
          if (*(char *)(in_RDI + 0x8f4a + (ulong)uVar11) == '\0') {
            __assert_fail("d->m_huff_code_sizes[0][lit]",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_miniz.h"
                          ,0x6e5,"mz_bool buminiz::tdefl_compress_lz_codes(tdefl_compressor *)");
          }
          local_38 = (ulong)*(ushort *)(in_RDI + 0x888a + (ulong)uVar11 * 2) <<
                     ((byte)local_3c & 0x3f) | local_38;
          local_3c = *(byte *)(in_RDI + 0x8f4a + (ulong)uVar11) + local_3c;
          pbVar12 = local_20 + 3;
          uVar11 = local_14 >> 2;
        }
      }
    }
    else {
      uVar6 = (uint)*local_20;
      uVar3 = *(ushort *)(local_20 + 1);
      uVar7 = (uint)uVar3;
      if (*(char *)(in_RDI + 0x8f4a + (ulong)*(ushort *)(s_tdefl_len_sym + (ulong)uVar6 * 2)) ==
          '\0') {
        __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_miniz.h"
                      ,0x6c4,"mz_bool buminiz::tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      iVar8 = *(byte *)(in_RDI + 0x8f4a + (ulong)*(ushort *)(s_tdefl_len_sym + (ulong)uVar6 * 2)) +
              local_3c;
      iVar9 = (uint)(byte)s_tdefl_len_extra[uVar6] + iVar8;
      bVar1 = s_tdefl_large_dist_sym[uVar3 >> 8];
      bVar2 = s_tdefl_large_dist_extra[uVar3 >> 8];
      if (uVar7 < 0x200) {
        bVar1 = s_tdefl_small_dist_sym[uVar7 & 0x1ff];
      }
      local_78 = (uint)bVar1;
      if (uVar7 < 0x200) {
        bVar2 = s_tdefl_small_dist_extra[uVar7 & 0x1ff];
      }
      local_7c = (uint)bVar2;
      if (*(char *)(in_RDI + 0x906a + (ulong)local_78) == '\0') {
        __assert_fail("d->m_huff_code_sizes[1][sym]",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_miniz.h"
                      ,0x6d0,"mz_bool buminiz::tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      iVar10 = (uint)*(byte *)(in_RDI + 0x906a + (ulong)local_78) + iVar9;
      local_38 = (ulong)(uVar7 & *(uint *)(mz_bitmasks + (ulong)local_7c * 4)) <<
                 ((byte)iVar10 & 0x3f) |
                 (ulong)*(ushort *)(in_RDI + 0x8aca + (ulong)local_78 * 2) << ((byte)iVar9 & 0x3f) |
                 (ulong)(uVar6 & *(uint *)(mz_bitmasks + (ulong)(byte)s_tdefl_len_extra[uVar6] * 4))
                 << ((byte)iVar8 & 0x3f) |
                 (ulong)*(ushort *)
                         (in_RDI + 0x888a +
                         (ulong)*(ushort *)(s_tdefl_len_sym + (ulong)uVar6 * 2) * 2) <<
                 ((byte)local_3c & 0x3f) | local_38;
      local_3c = local_7c + iVar10;
      pbVar12 = local_20 + 3;
    }
    local_14 = uVar11;
    local_20 = pbVar12;
    if (*(ulong **)(in_RDI + 0x48) <= local_28) {
      return 0;
    }
    *local_28 = local_38;
    local_28 = (ulong *)((long)local_28 + (ulong)(local_3c >> 3));
    local_38 = local_38 >> ((byte)local_3c & 0x38);
    local_3c = local_3c & 7;
    local_14 = local_14 >> 1;
  } while( true );
}

Assistant:

static mz_bool tdefl_compress_lz_codes(tdefl_compressor *d)
{
  mz_uint flags;
  mz_uint8 *pLZ_codes;
  mz_uint8 *pOutput_buf = d->m_pOutput_buf;
  mz_uint8 *pLZ_code_buf_end = d->m_pLZ_code_buf;
  mz_uint64 bit_buffer = d->m_bit_buffer;
  mz_uint bits_in = d->m_bits_in;

#define TDEFL_PUT_BITS_FAST(b, l) { bit_buffer |= (((mz_uint64)(b)) << bits_in); bits_in += (l); }

  flags = 1;
  for (pLZ_codes = d->m_lz_code_buf; pLZ_codes < pLZ_code_buf_end; flags >>= 1)
  {
    if (flags == 1)
      flags = *pLZ_codes++ | 0x100;

    if (flags & 1)
    {
      mz_uint s0, s1, n0, n1, sym, num_extra_bits;
      mz_uint match_len = pLZ_codes[0], match_dist = *(const mz_uint16 *)(pLZ_codes + 1); pLZ_codes += 3;

      MZ_ASSERT(d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]);
      TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][s_tdefl_len_sym[match_len]], d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]);
      TDEFL_PUT_BITS_FAST(match_len & mz_bitmasks[s_tdefl_len_extra[match_len]], s_tdefl_len_extra[match_len]);

      // This sequence coaxes MSVC into using cmov's vs. jmp's.
      s0 = s_tdefl_small_dist_sym[match_dist & 511];
      n0 = s_tdefl_small_dist_extra[match_dist & 511];
      s1 = s_tdefl_large_dist_sym[match_dist >> 8];
      n1 = s_tdefl_large_dist_extra[match_dist >> 8];
      sym = (match_dist < 512) ? s0 : s1;
      num_extra_bits = (match_dist < 512) ? n0 : n1;

      MZ_ASSERT(d->m_huff_code_sizes[1][sym]);
      TDEFL_PUT_BITS_FAST(d->m_huff_codes[1][sym], d->m_huff_code_sizes[1][sym]);
      TDEFL_PUT_BITS_FAST(match_dist & mz_bitmasks[num_extra_bits], num_extra_bits);
    }
    else
    {
      mz_uint lit = *pLZ_codes++;
      MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
      TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);

      if (((flags & 2) == 0) && (pLZ_codes < pLZ_code_buf_end))
      {
        flags >>= 1;
        lit = *pLZ_codes++;
        MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
        TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);

        if (((flags & 2) == 0) && (pLZ_codes < pLZ_code_buf_end))
        {
          flags >>= 1;
          lit = *pLZ_codes++;
          MZ_ASSERT(d->m_huff_code_sizes[0][lit]);
          TDEFL_PUT_BITS_FAST(d->m_huff_codes[0][lit], d->m_huff_code_sizes[0][lit]);
        }
      }
    }

    if (pOutput_buf >= d->m_pOutput_buf_end)
      return MZ_FALSE;

    *(mz_uint64*)pOutput_buf = bit_buffer;
    pOutput_buf += (bits_in >> 3);
    bit_buffer >>= (bits_in & ~7);
    bits_in &= 7;
  }

#undef TDEFL_PUT_BITS_FAST

  d->m_pOutput_buf = pOutput_buf;
  d->m_bits_in = 0;
  d->m_bit_buffer = 0;

  while (bits_in)
  {
    mz_uint32 n = MZ_MIN(bits_in, 16);
    TDEFL_PUT_BITS((mz_uint)bit_buffer & mz_bitmasks[n], n);
    bit_buffer >>= n;
    bits_in -= n;
  }

  TDEFL_PUT_BITS(d->m_huff_codes[0][256], d->m_huff_code_sizes[0][256]);

  return (d->m_pOutput_buf < d->m_pOutput_buf_end);
}